

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_mkdir(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  char *__path;
  ulong uVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  int mode;
  
  iVar4 = 6;
  if (argc < 2) {
    mode = 0x1ff;
LAB_00110d9f:
    __path = JS_ToCString(ctx,*argv);
    if (__path != (char *)0x0) {
      iVar1 = mkdir(__path,mode);
      uVar2 = js_get_errno((long)iVar1);
      JS_FreeCString(ctx,__path);
      JVar3.ptr = (void *)(uVar2 & 0xffffffff);
      iVar4 = 0;
      goto LAB_00110de0;
    }
  }
  else {
    iVar1 = JS_ToInt32(ctx,&mode,argv[1]);
    if (iVar1 == 0) goto LAB_00110d9f;
  }
  JVar3.float64 = 0.0;
LAB_00110de0:
  JVar5.tag = iVar4;
  JVar5.u.ptr = JVar3.ptr;
  return JVar5;
}

Assistant:

static JSValue js_os_mkdir(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    int mode, ret;
    const char *path;
    
    if (argc >= 2) {
        if (JS_ToInt32(ctx, &mode, argv[1]))
            return JS_EXCEPTION;
    } else {
        mode = 0777;
    }
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
#if defined(_WIN32)
    (void)mode;
    ret = js_get_errno(mkdir(path));
#else
    ret = js_get_errno(mkdir(path, mode));
#endif
    JS_FreeCString(ctx, path);
    return JS_NewInt32(ctx, ret);
}